

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void duckdb::RLESelect<short>
               (ColumnSegment *segment,ColumnScanState *state,idx_t vector_count,Vector *result,
               SelectionVector *sel,idx_t sel_count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  RLEScanState<short> *scan_state;
  idx_t iVar3;
  InternalException *this;
  idx_t iVar4;
  idx_t iVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  short *data_pointer;
  rle_count_t *index_pointer;
  string local_50;
  
  scan_state = (RLEScanState<short> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(scan_state->handle).node);
  pdVar1 = ((scan_state->handle).node.ptr)->buffer;
  data_pointer = (short *)(pdVar1 + segment->offset + 8);
  index_pointer = (rle_count_t *)(pdVar1 + (ulong)scan_state->rle_count_offset + segment->offset);
  if ((vector_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<short>(scan_state,index_pointer,data_pointer,0x800,result);
    return;
  }
  pdVar1 = result->data;
  iVar3 = 0;
  Vector::SetVectorType(result,FLAT_VECTOR);
  if (sel_count != 0) {
    psVar2 = sel->sel_vector;
    iVar4 = 0;
    uVar8 = 0;
    do {
      iVar3 = iVar4;
      if (psVar2 != (sel_t *)0x0) {
        iVar3 = (idx_t)psVar2[iVar4];
      }
      uVar6 = iVar3 - uVar8;
      if (iVar3 < uVar8) {
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "Error in RLESelect - selection vector indices are not ordered","");
        InternalException::InternalException(this,&local_50);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar5 = scan_state->entry_pos;
      if (uVar6 != 0) {
        iVar7 = scan_state->position_in_entry;
        do {
          uVar8 = index_pointer[iVar5] - iVar7;
          if (uVar6 < uVar8) {
            uVar8 = uVar6;
          }
          iVar7 = iVar7 + uVar8;
          if (index_pointer[iVar5] <= iVar7) {
            iVar5 = iVar5 + 1;
            scan_state->entry_pos = iVar5;
            iVar7 = 0;
          }
          uVar6 = uVar6 - uVar8;
        } while (uVar6 != 0);
        scan_state->position_in_entry = iVar7;
      }
      *(short *)(pdVar1 + iVar4 * 2) = data_pointer[iVar5];
      iVar4 = iVar4 + 1;
      uVar8 = iVar3;
    } while (iVar4 != sel_count);
  }
  uVar8 = vector_count - iVar3;
  if (uVar8 != 0) {
    iVar3 = scan_state->entry_pos;
    iVar4 = scan_state->position_in_entry;
    do {
      uVar6 = index_pointer[iVar3] - iVar4;
      if (uVar8 < uVar6) {
        uVar6 = uVar8;
      }
      iVar4 = iVar4 + uVar6;
      if (index_pointer[iVar3] <= iVar4) {
        iVar3 = iVar3 + 1;
        scan_state->entry_pos = iVar3;
        iVar4 = 0;
      }
      uVar8 = uVar8 - uVar6;
    } while (uVar8 != 0);
    scan_state->position_in_entry = iVar4;
  }
  return;
}

Assistant:

void RLESelect(ColumnSegment &segment, ColumnScanState &state, idx_t vector_count, Vector &result,
               const SelectionVector &sel, idx_t sel_count) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run we don't need to select at all
	if (CanEmitConstantVector<true>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos], vector_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, vector_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t prev_idx = 0;
	for (idx_t i = 0; i < sel_count; i++) {
		auto next_idx = sel.get_index(i);
		if (next_idx < prev_idx) {
			throw InternalException("Error in RLESelect - selection vector indices are not ordered");
		}
		// skip forward to the next index
		scan_state.SkipInternal(index_pointer, next_idx - prev_idx);
		// read the element
		result_data[i] = data_pointer[scan_state.entry_pos];
		// move the next to the prev
		prev_idx = next_idx;
	}
	// skip the tail
	scan_state.SkipInternal(index_pointer, vector_count - prev_idx);
}